

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

void nni_aio_expire_q_free(nni_aio_expire_q *eq)

{
  if (eq != (nni_aio_expire_q *)0x0) {
    if (eq->eq_stop == false) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",
                0x33a,"eq->eq_stop");
    }
    if (eq->eq_exit == false) {
      nni_mtx_lock(&eq->eq_mtx);
      eq->eq_exit = true;
      nni_cv_wake(&eq->eq_cv);
      nni_mtx_unlock(&eq->eq_mtx);
    }
    nni_thr_fini(&eq->eq_thr);
    nni_cv_fini(&eq->eq_cv);
    nni_mtx_fini(&eq->eq_mtx);
    nni_free(eq,0x120);
    return;
  }
  return;
}

Assistant:

static void
nni_aio_expire_q_free(nni_aio_expire_q *eq)
{
	if (eq == NULL) {
		return;
	}
	NNI_ASSERT(eq->eq_stop);
	if (!eq->eq_exit) {
		nni_mtx_lock(&eq->eq_mtx);
		eq->eq_exit = true;
		nni_cv_wake(&eq->eq_cv);
		nni_mtx_unlock(&eq->eq_mtx);
	}

	nni_thr_fini(&eq->eq_thr);
	nni_cv_fini(&eq->eq_cv);
	nni_mtx_fini(&eq->eq_mtx);
	NNI_FREE_STRUCT(eq);
}